

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibverbs_communicator.cpp
# Opt level: O0

void __thiscall IBVerbsCommunicator::RecvWait(IBVerbsCommunicator *this,int src_rank)

{
  bool bVar1;
  reference pvVar2;
  ibv_mr **ppiVar3;
  int in_ESI;
  long in_RDI;
  ibv_mr **save;
  IBVerbsCommunicator *in_stack_00000028;
  
  do {
    bVar1 = RecvPoll(in_stack_00000028,this._4_4_);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  pvVar2 = std::
           vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>::
           operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                       *)(in_RDI + 0x68),(long)in_ESI);
  ppiVar3 = &pvVar2->second;
  if (*ppiVar3 != (ibv_mr *)0x0) {
    ibv_dereg_mr(*ppiVar3);
    *ppiVar3 = (ibv_mr *)0x0;
  }
  return;
}

Assistant:

void IBVerbsCommunicator::RecvWait(int src_rank) {
  while (!RecvPoll(src_rank)) {
  }

  // unregister memory region from non-blocking io wait list
  auto& save = mr_world_[src_rank].second;
  if (save != NULL) {
    ibv_dereg_mr(save);
    save = NULL;
  }
}